

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool ON_IsConicEquationAnEllipse
               (double *conic,ON_2dPoint *center,ON_2dVector *major_axis,ON_2dVector *minor_axis,
               double *major_radius,double *minor_radius)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = *conic;
  if (ABS(dVar1) < 1.23432101234321e+308) {
    dVar3 = ABS(conic[1]);
    if (dVar3 < 1.23432101234321e+308) {
      dVar4 = conic[2];
      if ((((ABS(dVar4) < 1.23432101234321e+308) &&
           (dVar6 = conic[3], ABS(dVar6) < 1.23432101234321e+308)) &&
          (dVar8 = conic[4], ABS(dVar8) < 1.23432101234321e+308)) &&
         (ABS(conic[5]) < 1.23432101234321e+308)) {
        if (dVar3 <= ABS(ABS(dVar4) + dVar1) * 1e-14) {
          dVar5 = 1.0;
          dVar3 = 0.0;
          dVar7 = 0.0;
        }
        else {
          dVar1 = atan2(conic[1],dVar1 - dVar4);
          dVar3 = sin(dVar1 * 0.5);
          dVar5 = cos(dVar1 * 0.5);
          dVar7 = -dVar3;
          dVar4 = conic[1] * dVar5 * dVar3;
          dVar1 = dVar3 * conic[2] * dVar3 + dVar5 * *conic * dVar5 + dVar4;
          dVar4 = conic[2] * dVar5 * dVar5 + (*conic * dVar3 * dVar3 - dVar4);
          dVar6 = conic[3] * dVar5 + dVar3 * conic[4];
          dVar8 = conic[4] * dVar5 - dVar3 * conic[3];
        }
        if ((dVar1 <= 0.0) || (dVar4 <= 0.0)) {
          if (0.0 <= dVar1) {
            return false;
          }
          if (0.0 <= dVar4) {
            return false;
          }
        }
        dVar6 = (dVar6 * -0.5) / dVar1;
        dVar8 = (dVar8 * -0.5) / dVar4;
        dVar9 = conic[5] - (dVar1 * dVar6 * dVar6 + dVar4 * dVar8 * dVar8);
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          dVar1 = -dVar9 / dVar1;
          if (dVar1 < 0.0) {
            dVar1 = sqrt(dVar1);
          }
          else {
            dVar1 = SQRT(dVar1);
          }
          dVar4 = -dVar9 / dVar4;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          dVar9 = dVar1;
          if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
            if (dVar4 < dVar1) {
              major_axis->x = dVar5;
              major_axis->y = dVar3;
              minor_axis->x = dVar7;
              dVar2 = dVar5;
            }
            else {
              if (dVar4 <= dVar1) {
                return false;
              }
              major_axis->x = dVar7;
              major_axis->y = dVar5;
              minor_axis->x = -dVar5;
              dVar2 = -dVar3;
              dVar9 = dVar4;
              dVar4 = dVar1;
            }
          }
          else {
            major_axis->x = 1.0;
            major_axis->y = 0.0;
            minor_axis->x = 0.0;
            dVar2 = 1.0;
          }
          minor_axis->y = dVar2;
          *major_radius = dVar9;
          *minor_radius = dVar4;
          center->x = dVar6 * dVar5 + dVar7 * dVar8;
          center->y = dVar3 * dVar6 + dVar5 * dVar8;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_IsConicEquationAnEllipse( 
        const double conic[6], 
        ON_2dPoint& center, 
        ON_2dVector& major_axis, 
        ON_2dVector& minor_axis, 
        double* major_radius, 
        double* minor_radius
        )
{
  double A, C, D, E, F, x0, y0;
  double X[2], Y[2], P[2];

  if (    !ON_IsValid(conic[0]) 
       || !ON_IsValid(conic[1]) 
       || !ON_IsValid(conic[2]) 
       || !ON_IsValid(conic[3]) 
       || !ON_IsValid(conic[4]) 
       || !ON_IsValid(conic[5]) 
     )
  {
    return false;
  }

  if ( fabs(conic[1]) > 1.0e-14*fabs(conic[0]+fabs(conic[2])) ) 
  {
    // "B" is non zero - remove "rotation" from conic equation
    const double alpha = 0.5*atan2(conic[1],conic[0]-conic[2]);
    const double s = sin(alpha);
    const double c = cos(alpha);
    X[0] =  c; X[1] = s;
    Y[0] = -s; Y[1] = c;

    A = conic[0]*c*c + conic[1]*c*s + conic[2]*s*s;
    // B = conic[1]*(c*c-s*s) + 2.0*(conic[2]-conic[0])*s*c; // (B = 0)
    C = conic[0]*s*s - conic[1]*c*s + conic[2]*c*c;
    D = conic[3]*c + conic[4]*s;
    E = conic[4]*c - conic[3]*s;
    // F = conic[5]; // F not changed by rotation
  }
  else
  {
    A = conic[0];
    // B = conic[1];
    C = conic[2];
    D = conic[3];
    E = conic[4];
    // F = conic[5]; 
    X[0] = 1.0; X[1] = 0.0;
    Y[0] = 0.0; Y[1] = 1.0;
  }

  F = conic[5];

  // the if (!(...)) insures we exit if A or C is a NaN
  if ( !((A > 0.0 && C > 0.0) || (A < 0.0 && C < 0.0)) )
    return false; // conic is not an ellipse 

  // set P = center
  x0 = -0.5*D/A;
  y0 = -0.5*E/C;
  P[0] = x0*X[0] + y0*Y[0];
  P[1] = x0*X[1] + y0*Y[1];

  // set A and C to ellipse axes lengths
  F = conic[5] -(A*x0*x0 + C*y0*y0);
  if ( !(0.0 != F) )
    return false; // F is 0.0 or a NaN

  // We know A and C have the same sign and F has the opposite sign.
  A = sqrt(-F/A);
  C = sqrt(-F/C);

  if ( A == C )
  {
    // circle
    major_axis.x = 1.0;
    major_axis.y = 0.0;
    minor_axis.x = 0.0;
    minor_axis.y = 1.0;
    *major_radius = A;
    *minor_radius = C;
  }
  else if ( A > C )
  {
    // X = major axis, Y = minor axis
    major_axis.x = X[0];
    major_axis.y = X[1];
    minor_axis.x = Y[0];
    minor_axis.y = Y[1];
    *major_radius = A;
    *minor_radius = C;
  }
  else if ( C > A )
  {
    // Y = major axis, -X = minor axis
    major_axis.x = Y[0];
    major_axis.y = Y[1];
    minor_axis.x = -X[0];
    minor_axis.y = -X[1];
    *major_radius = C;
    *minor_radius = A;
  }
  else
  {
    // A or C is a NaN
    return false;
  }

  center.x = P[0];
  center.y = P[1];

  return true;
}